

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O2

void free_buckets(__cilkrts_worker *w,bucket **buckets,size_t nbuckets)

{
  bucket **bp;
  size_t sVar1;
  bool bVar2;
  
  bp = buckets;
  sVar1 = nbuckets;
  while (bVar2 = sVar1 != 0, sVar1 = sVar1 - 1, bVar2) {
    free_bucket(w,bp);
    bp = bp + 1;
  }
  __cilkrts_frame_free(w,buckets,nbuckets << 3);
  return;
}

Assistant:

static void free_buckets(__cilkrts_worker  *w, 
                         bucket           **buckets,
                         size_t             nbuckets)
{
    size_t i;

#if REDPAR_DEBUG >= 1
    verify_current_wkr(w);
    fprintf(stderr, "W=%d, desc=free_buckets, buckets=%p, size=%zd\n",
	    w->self, buckets,
	    nbuckets * sizeof(*buckets));
#endif

    for (i = 0; i < nbuckets; ++i)
        free_bucket(w, buckets + i);

    __cilkrts_frame_free(w, buckets, nbuckets * sizeof(*buckets));
}